

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::detail::
       parse_arg_id<char,fmt::v6::detail::precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  basic_format_parse_context<char,_fmt::v6::detail::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char> *pbVar3;
  uint id;
  unsigned_long_long uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  anon_union_16_15_1c6af150_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_1
  *__return_storage_ptr__;
  specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
  *psVar8;
  basic_string_view<char> name;
  format_arg arg;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  anon_union_16_15_1c6af150_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_1
  local_68;
  int local_58;
  undefined8 uStack_50;
  anon_union_16_15_1c6af150_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 uStack_30;
  
  if (begin == end) {
    assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar8 = handler->handler;
    pbVar2 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    id = pbVar2->next_arg_id_;
    if ((int)id < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    pbVar3 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ).context_;
    pbVar2->next_arg_id_ = id + 1;
    pbVar6 = (byte *)begin;
  }
  else {
    if (9 < (byte)(bVar1 - 0x30)) {
      if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_0018a0e2;
      pbVar6 = (byte *)(begin + 1);
      do {
        pbVar5 = pbVar6;
        pbVar7 = (byte *)end;
        if (pbVar5 == (byte *)end) break;
        bVar1 = *pbVar5;
        pbVar6 = pbVar5 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar7 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar7 - (long)begin;
      if ((long)name.size_ < 0) {
        assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
      }
      psVar8 = handler->handler;
      __return_storage_ptr__ = &local_68;
      name.data_ = begin;
      basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::get<char>((format_arg *)&__return_storage_ptr__->string,
                  &((psVar8->
                    super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                    ).context_)->args_,name);
      if (local_58 != 0) {
        local_48.long_long_value = local_68.long_long_value;
        local_48.string.size = local_68.string.size;
        uStack_30 = uStack_50;
        begin = &stack0xffffffffffffff90;
        uVar4 = visit_format_arg<fmt::v6::detail::precision_checker<fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>
                          ((precision_checker<fmt::v6::detail::error_handler> *)begin,
                           (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                            *)&local_48.string);
        if ((uVar4 & 0xffffffff80000000) == 0) {
          ((psVar8->
           super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
           ).super_specs_setter<char>.specs_)->precision = (int)uVar4;
          return (char *)pbVar7;
        }
        goto LAB_0018a0a6;
      }
      goto LAB_0018a0ca;
    }
    pbVar6 = (byte *)(begin + 1);
    id = 0;
    pbVar7 = pbVar6;
    if (bVar1 != 0x30) {
      do {
        if (0xccccccc < id) goto LAB_0018a0a6;
        id = ((uint)bVar1 + id * 10) - 0x30;
        pbVar6 = (byte *)end;
        if (pbVar7 == (byte *)end) break;
        bVar1 = *pbVar7;
        pbVar6 = pbVar7;
        pbVar7 = pbVar7 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      if ((int)id < 0) goto LAB_0018a0a6;
    }
    if ((pbVar6 == (byte *)end) || ((*pbVar6 != 0x3a && (*pbVar6 != 0x7d)))) {
LAB_0018a0e2:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    psVar8 = handler->handler;
    pbVar2 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    if (0 < pbVar2->next_arg_id_) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from automatic to manual argument indexing");
    }
    pbVar2->next_arg_id_ = -1;
    pbVar3 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ).context_;
  }
  __return_storage_ptr__ = &local_68;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  ::get((format_arg *)&__return_storage_ptr__->string,&pbVar3->args_,id);
  if (local_58 != 0) {
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    uStack_30 = uStack_50;
    begin = &stack0xffffffffffffff90;
    uVar4 = visit_format_arg<fmt::v6::detail::precision_checker<fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>
                      ((precision_checker<fmt::v6::detail::error_handler> *)begin,
                       (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                        *)&local_48.string);
    if ((uVar4 & 0xffffffff80000000) == 0) {
      ((psVar8->
       super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
       ).super_specs_setter<char>.specs_)->precision = (int)uVar4;
      return (char *)pbVar6;
    }
LAB_0018a0a6:
    error_handler::on_error((error_handler *)begin,"number is too big");
  }
LAB_0018a0ca:
  error_handler::on_error((error_handler *)&__return_storage_ptr__->string,"argument not found");
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}